

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedCoverage.cpp
# Opt level: O2

int __thiscall
glcts::DrawBuffersIndexedCoverage::init(DrawBuffersIndexedCoverage *this,EVP_PKEY_CTX *ctx)

{
  NotSupportedError *this_00;
  bool bVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GL_OES_draw_buffers_indexed",&local_39);
  bVar1 = TestCaseBase::isExtensionSupported(&this->super_TestCaseBase,&local_38);
  iVar2 = std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    return iVar2;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Draw buffers indexed functionality not supported, skipping",
             &local_39);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DrawBuffersIndexedCoverage::init()
{
	if (!isExtensionSupported("GL_OES_draw_buffers_indexed"))
	{
		throw tcu::NotSupportedError(DRAW_BUFFERS_INDEXED_NOT_SUPPORTED);
	}
}